

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

void __thiscall SVGChart::PlotDataContainer::ClearData(PlotDataContainer *this)

{
  pointer ppPVar1;
  pointer ppLVar2;
  pointer ppDVar3;
  pointer ppPVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  undefined8 *puVar8;
  void *pvVar9;
  long lVar10;
  pointer ppDVar11;
  pointer ppPVar12;
  pointer ppPVar13;
  long lVar14;
  pointer ppLVar15;
  pointer ppPVar16;
  pointer ppPVar17;
  
  ppPVar17 = (this->mXDataList).
             super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppPVar13 = (this->mXDataList).
             super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppPVar1 = (this->mYDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->mLegendDataList).
            super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppDVar3 = (this->mDataDrawerList).
            super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar4 = (this->mPlotDataSelectionList).
            super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar16 = (this->mYDataList).
             super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppLVar15 = (this->mLegendDataList).
             super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppDVar11 = (this->mDataDrawerList).
             super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppPVar12 = (this->mPlotDataSelectionList).
             super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar4 != ppPVar12 &&
      ((ppDVar3 != ppDVar11 && ppLVar2 != ppLVar15) && (ppPVar1 != ppPVar16 && ppPVar17 != ppPVar13)
      )) {
    lVar14 = 0;
    do {
      plVar5 = *(long **)((long)ppPVar1 + lVar14);
      puVar6 = *(undefined8 **)((long)ppLVar2 + lVar14);
      plVar7 = *(long **)((long)ppDVar3 + lVar14);
      puVar8 = *(undefined8 **)((long)ppPVar4 + lVar14);
      if (*(long **)((long)ppPVar17 + lVar14) != (long *)0x0) {
        (**(code **)(**(long **)((long)ppPVar17 + lVar14) + 8))();
      }
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))(plVar5);
      }
      if (puVar6 != (undefined8 *)0x0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(puVar6 + 0xf));
        if ((long *)puVar6[0xb] != puVar6 + 0xd) {
          operator_delete((long *)puVar6[0xb],puVar6[0xd] + 1);
        }
        if ((long *)puVar6[6] != puVar6 + 8) {
          operator_delete((long *)puVar6[6],puVar6[8] + 1);
        }
        if ((long *)*puVar6 != puVar6 + 2) {
          operator_delete((long *)*puVar6,puVar6[2] + 1);
        }
      }
      operator_delete(puVar6,0xa8);
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 8))(plVar7);
      }
      if ((puVar8 != (undefined8 *)0x0) && (pvVar9 = (void *)*puVar8, pvVar9 != (void *)0x0)) {
        operator_delete(pvVar9,puVar8[2] - (long)pvVar9);
      }
      operator_delete(puVar8,0x18);
      ppPVar13 = (this->mXDataList).
                 super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppPVar16 = (this->mYDataList).
                 super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppLVar15 = (this->mLegendDataList).
                 super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppDVar11 = (this->mDataDrawerList).
                 super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppPVar12 = (this->mPlotDataSelectionList).
                 super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (((((pointer)((long)ppPVar17 + lVar14 + 8) == ppPVar13) ||
           ((pointer)((long)ppPVar1 + lVar14 + 8) == ppPVar16)) ||
          ((pointer)((long)ppLVar2 + lVar14 + 8) == ppLVar15)) ||
         ((pointer)((long)ppDVar3 + lVar14 + 8) == ppDVar11)) break;
      lVar10 = lVar14 + 8;
      lVar14 = lVar14 + 8;
    } while ((pointer)((long)ppPVar4 + lVar10) != ppPVar12);
    ppPVar17 = (this->mXDataList).
               super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppPVar13 != ppPVar17) {
    (this->mXDataList).
    super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar17;
  }
  ppPVar17 = (this->mYDataList).
             super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar16 != ppPVar17) {
    (this->mYDataList).
    super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar17;
  }
  ppLVar2 = (this->mLegendDataList).
            super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar15 != ppLVar2) {
    (this->mLegendDataList).
    super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar2;
  }
  ppDVar3 = (this->mDataDrawerList).
            super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppDVar11 != ppDVar3) {
    (this->mDataDrawerList).
    super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppDVar3;
  }
  ppPVar4 = (this->mPlotDataSelectionList).
            super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar12 != ppPVar4) {
    (this->mPlotDataSelectionList).
    super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar4;
  }
  return;
}

Assistant:

void PlotDataContainer::ClearData () {
      PlotDataList::iterator theXI = mXDataList.begin ();
      PlotDataList::iterator theYI = mYDataList.begin ();
      LegendDataList::iterator theLI = mLegendDataList.begin ();
      DataDrawerList::iterator theDI = mDataDrawerList.begin ();
      PlotDataSelectionList::iterator thePI = mPlotDataSelectionList.begin ();

      for (;theXI!=mXDataList.end () && theYI!=mYDataList.end () && theLI!=mLegendDataList.end () && theDI != mDataDrawerList.end () && thePI != mPlotDataSelectionList.end ();) {
        PlotDataBase *theX = *theXI;
        PlotDataBase *theY = *theYI;
        LegendData *theL = *theLI;
        DataDrawerBase *theD = *theDI;
        PlotDataSelection *theP = *thePI;

        delete theX;
        delete theY;
        delete theL;
        delete theD;
        delete theP;

        theXI++;
        theYI++;
        theLI++;
        theDI++;
        thePI++;
      }
      mXDataList.clear ();
      mYDataList.clear ();
      mLegendDataList.clear ();
      mDataDrawerList.clear ();
      mPlotDataSelectionList.clear ();
    }